

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_isTeammate
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *other;
  AActor *this;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00434eeb;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00434ed2:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00434eeb:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1b0b,
                  "int AF_AActor_isTeammate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_00434e40;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00434eeb;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00434ed2;
LAB_00434e40:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00434f0a;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00434edb:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00434f0a;
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_00434e6f;
  }
  else {
    if (other != (AActor *)0x0) goto LAB_00434edb;
LAB_00434e6f:
    NullParam("\"other\"");
    other = (AActor *)param[1].field_0.field_1.a;
    if (other == (AActor *)0x0) {
      other = (AActor *)0x0;
      goto LAB_00434ea3;
    }
  }
  bVar1 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar3 = "other == NULL || other->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00434f0a:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1b0c,
                  "int AF_AActor_isTeammate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00434ea3:
  bVar1 = AActor::IsTeammate(this,other);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1b0d,
                    "int AF_AActor_isTeammate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,(uint)bVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, isTeammate)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(other, AActor);
	ACTION_RETURN_BOOL(self->IsTeammate(other));
}